

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.upb.h
# Opt level: O3

void upb_test_set_nest(upb_test_TestFreeze *msg,upb_test_TestFreeze *val,upb_Arena *arena)

{
  upb_Extension *puVar1;
  
  if ((upb_test_nest_ext.field_dont_copy_me__upb_internal_use_only.
       mode_dont_copy_me__upb_internal_use_only & 3) != 2) {
    __assert_fail("upb_MiniTableField_IsScalar(&ext->field_dont_copy_me__upb_internal_use_only)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/upb/message/test.upb.h"
                  ,0xccf,
                  "void upb_test_set_nest(struct upb_test_TestFreeze *, const upb_test_TestFreeze *, upb_Arena *)"
                 );
  }
  if (upb_test_nest_ext.field_dont_copy_me__upb_internal_use_only.
      mode_dont_copy_me__upb_internal_use_only < 0xc0) {
    __assert_fail("_upb_MiniTableField_GetRep_dont_copy_me__upb_internal_use_only( &ext->field_dont_copy_me__upb_internal_use_only) == kUpb_FieldRep_8Byte"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/upb/message/test.upb.h"
                  ,0xcd1,
                  "void upb_test_set_nest(struct upb_test_TestFreeze *, const upb_test_TestFreeze *, upb_Arena *)"
                 );
  }
  if (((ulong)(msg->base_dont_copy_me__upb_internal_use_only).field_0 & 1) != 0) {
    __assert_fail("!upb_Message_IsFrozen(msg)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                  ,0x145,
                  "bool upb_Message_SetExtension(struct upb_Message *, const upb_MiniTableExtension *, const void *, upb_Arena *)"
                 );
  }
  if (arena != (upb_Arena *)0x0) {
    puVar1 = _upb_Message_GetOrCreateExtension_dont_copy_me__upb_internal_use_only
                       (&msg->base_dont_copy_me__upb_internal_use_only,&upb_test_nest_ext,arena);
    if (puVar1 != (upb_Extension *)0x0) {
      (*(code *)(&DAT_00393530 +
                *(int *)(&DAT_00393530 +
                        (ulong)(upb_test_nest_ext.field_dont_copy_me__upb_internal_use_only.
                                mode_dont_copy_me__upb_internal_use_only >> 6) * 4)))();
      return;
    }
    __assert_fail("ok",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/upb/message/test.upb.h"
                  ,0xcd3,
                  "void upb_test_set_nest(struct upb_test_TestFreeze *, const upb_test_TestFreeze *, upb_Arena *)"
                 );
  }
  __assert_fail("a",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                ,0x146,
                "bool upb_Message_SetExtension(struct upb_Message *, const upb_MiniTableExtension *, const void *, upb_Arena *)"
               );
}

Assistant:

UPB_INLINE void upb_test_set_nest(struct upb_test_TestFreeze* msg, const upb_test_TestFreeze* val, upb_Arena* arena) {
  const upb_MiniTableExtension* ext = &upb_test_nest_ext;
  UPB_ASSUME(upb_MiniTableField_IsScalar(&ext->UPB_PRIVATE(field)));
  UPB_ASSUME(UPB_PRIVATE(_upb_MiniTableField_GetRep)(
                 &ext->UPB_PRIVATE(field)) == UPB_SIZE(kUpb_FieldRep_4Byte, kUpb_FieldRep_8Byte));
  bool ok = upb_Message_SetExtension((upb_Message*)msg, ext, &val, arena);
  UPB_ASSERT(ok);
}